

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

void PFlushLineImpl(TidyDocImpl *doc)

{
  Bool BVar1;
  uint local_1c;
  uint i;
  TidyPrintImpl *pprint;
  TidyDocImpl *doc_local;
  
  CheckWrapLine(doc);
  BVar1 = WantIndent(doc);
  if (BVar1 != no) {
    WriteIndentChar(doc);
  }
  for (local_1c = 0; local_1c < (doc->pprint).linelen; local_1c = local_1c + 1) {
    prvTidyWriteChar((doc->pprint).linebuf[local_1c],doc->docOut);
  }
  BVar1 = IsInString(&doc->pprint);
  if (BVar1 != no) {
    prvTidyWriteChar(0x5c,doc->docOut);
  }
  ResetLine(&doc->pprint);
  (doc->pprint).linelen = 0;
  return;
}

Assistant:

static void PFlushLineImpl( TidyDocImpl* doc )
{
    TidyPrintImpl* pprint = &doc->pprint;

    uint i;

    CheckWrapLine( doc );

    if ( WantIndent(doc) )
        WriteIndentChar(doc);

    for ( i = 0; i < pprint->linelen; ++i )
        TY_(WriteChar)( pprint->linebuf[i], doc->docOut );

    if ( IsInString(pprint) )
        TY_(WriteChar)( '\\', doc->docOut );
    ResetLine( pprint );
    pprint->linelen = 0;
}